

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restore.c
# Opt level: O0

fruit * loadfruitchn(memfile *mf)

{
  int32_t iVar1;
  fruit *pfVar2;
  int local_34;
  fruit *pfStack_30;
  uint count;
  fruit *fprev;
  fruit *fcurr;
  fruit *fnext;
  fruit *flist;
  memfile *mf_local;
  
  fnext = (fruit *)0x0;
  mfmagic_check(mf,0x48435246);
  local_34 = mread32(mf);
  while (local_34 != 0) {
    pfVar2 = (fruit *)malloc(0x30);
    mread(mf,pfVar2,0x20);
    iVar1 = mread32(mf);
    pfVar2->fid = iVar1;
    pfVar2->nextf = fnext;
    local_34 = local_34 + -1;
    fnext = pfVar2;
  }
  fprev = fnext;
  pfStack_30 = (fruit *)0x0;
  while (fprev != (fruit *)0x0) {
    pfVar2 = fprev->nextf;
    fprev->nextf = pfStack_30;
    pfStack_30 = fprev;
    fprev = pfVar2;
  }
  return pfStack_30;
}

Assistant:

static struct fruit *loadfruitchn(struct memfile *mf)
{
	struct fruit *flist = NULL, *fnext, *fcurr, *fprev;
	unsigned int count;

	mfmagic_check(mf, FRUITCHAIN_MAGIC);
	count = mread32(mf);
	while (count--) {
	    fnext = newfruit();
	    mread(mf, fnext->fname, sizeof(fnext->fname));
	    fnext->fid = mread32(mf);
	    fnext->nextf = flist;
	    flist = fnext;
	}

	/* fruit list loaded above is reversed, so put it back in the right order */
	fcurr = flist;
	fprev = NULL;
	while (fcurr) {
	    fnext = fcurr->nextf;
	    fcurr->nextf = fprev;
	    fprev = fcurr;
	    fcurr = fnext;
	}
	flist = fprev;

	return flist;
}